

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.cpp
# Opt level: O2

namespace_t * __thiscall
cfgfile::generator::cfg::tag_namespace_t::cfg
          (namespace_t *__return_storage_ptr__,tag_namespace_t *this)

{
  pos_t pVar1;
  bool bVar2;
  tag_namespace_t *this_00;
  tag_class_t *this_01;
  ulong uVar3;
  class_t cStack_e8;
  
  (__return_storage_ptr__->m_name)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_name).field_2;
  (__return_storage_ptr__->m_name)._M_string_length = 0;
  (__return_storage_ptr__->m_name).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->m_nested_namespaces).
  super__Vector_base<cfgfile::generator::cfg::namespace_t,_std::allocator<cfgfile::generator::cfg::namespace_t>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->m_nested_namespaces).
  super__Vector_base<cfgfile::generator::cfg::namespace_t,_std::allocator<cfgfile::generator::cfg::namespace_t>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 (*) [16])
   &(__return_storage_ptr__->m_nested_namespaces).
    super__Vector_base<cfgfile::generator::cfg::namespace_t,_std::allocator<cfgfile::generator::cfg::namespace_t>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  (__return_storage_ptr__->m_classes).
  super__Vector_base<cfgfile::generator::cfg::class_t,_std::allocator<cfgfile::generator::cfg::class_t>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->m_classes).
  super__Vector_base<cfgfile::generator::cfg::class_t,_std::allocator<cfgfile::generator::cfg::class_t>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined4 *)&__return_storage_ptr__->m_line_number = 0xffffffff;
  *(undefined4 *)((long)&__return_storage_ptr__->m_line_number + 4) = 0xffffffff;
  *(undefined4 *)&__return_storage_ptr__->m_column_number = 0xffffffff;
  *(undefined4 *)((long)&__return_storage_ptr__->m_column_number + 4) = 0xffffffff;
  __return_storage_ptr__->m_parent = (namespace_t *)0x0;
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  pVar1 = (this->
          super_tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
          ).super_tag_t<cfgfile::string_trait_t>.m_column_number;
  __return_storage_ptr__->m_line_number =
       (this->
       super_tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
       ).super_tag_t<cfgfile::string_trait_t>.m_line_number;
  __return_storage_ptr__->m_column_number = pVar1;
  bVar2 = tag_t<cfgfile::string_trait_t>::is_defined
                    (&(this->m_nested_namespaces).super_tag_t<cfgfile::string_trait_t>);
  if (bVar2) {
    for (uVar3 = 0;
        uVar3 < (ulong)((long)(this->m_nested_namespaces).m_tags.
                              super__Vector_base<std::shared_ptr<cfgfile::generator::cfg::tag_namespace_t>,_std::allocator<std::shared_ptr<cfgfile::generator::cfg::tag_namespace_t>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->m_nested_namespaces).m_tags.
                              super__Vector_base<std::shared_ptr<cfgfile::generator::cfg::tag_namespace_t>,_std::allocator<std::shared_ptr<cfgfile::generator::cfg::tag_namespace_t>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 4); uVar3 = uVar3 + 1) {
      this_00 = tag_vector_of_tags_t<cfgfile::generator::cfg::tag_namespace_t,_cfgfile::string_trait_t>
                ::at(&this->m_nested_namespaces,uVar3);
      cfg((namespace_t *)&cStack_e8,this_00);
      std::
      vector<cfgfile::generator::cfg::namespace_t,_std::allocator<cfgfile::generator::cfg::namespace_t>_>
      ::push_back(&__return_storage_ptr__->m_nested_namespaces,(value_type *)&cStack_e8);
      namespace_t::~namespace_t((namespace_t *)&cStack_e8);
    }
  }
  bVar2 = tag_t<cfgfile::string_trait_t>::is_defined
                    (&(this->m_classes).super_tag_t<cfgfile::string_trait_t>);
  if (bVar2) {
    for (uVar3 = 0;
        uVar3 < (ulong)((long)(this->m_classes).m_tags.
                              super__Vector_base<std::shared_ptr<cfgfile::generator::cfg::tag_class_t>,_std::allocator<std::shared_ptr<cfgfile::generator::cfg::tag_class_t>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->m_classes).m_tags.
                              super__Vector_base<std::shared_ptr<cfgfile::generator::cfg::tag_class_t>,_std::allocator<std::shared_ptr<cfgfile::generator::cfg::tag_class_t>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 4); uVar3 = uVar3 + 1) {
      this_01 = tag_vector_of_tags_t<cfgfile::generator::cfg::tag_class_t,_cfgfile::string_trait_t>
                ::at(&this->m_classes,uVar3);
      tag_class_t::cfg(&cStack_e8,this_01);
      std::
      vector<cfgfile::generator::cfg::class_t,_std::allocator<cfgfile::generator::cfg::class_t>_>::
      push_back(&__return_storage_ptr__->m_classes,&cStack_e8);
      class_t::~class_t(&cStack_e8);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

namespace_t
tag_namespace_t::cfg() const
{
	namespace_t n;
	n.set_name( value() );
	n.set_line_number( line_number() );
	n.set_column_number( column_number() );

	if( m_nested_namespaces.is_defined() )
	{
		for( std::size_t i = 0; i < m_nested_namespaces.size(); ++i )
			n.add_namespace( m_nested_namespaces.at( i ).cfg() );
	}

	if( m_classes.is_defined() )
	{
		for( std::size_t i = 0; i < m_classes.size(); ++i )
			n.add_class( m_classes.at( i ).cfg() );
	}

	return n;
}